

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_comparison_join.cpp
# Opt level: O2

void duckdb::PhysicalComparisonJoin::ConstructEmptyJoinResult
               (JoinType join_type,bool has_null,DataChunk *input,DataChunk *result)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  ulong __n;
  reference pvVar3;
  reference pvVar4;
  reference other;
  idx_t iVar5;
  undefined7 in_register_00000039;
  idx_t i;
  ulong uVar6;
  idx_t k;
  
  switch((int)CONCAT71(in_register_00000039,join_type)) {
  case 1:
  case 4:
  case 8:
    result->count = input->count;
    for (uVar6 = 0;
        __n = ((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x68, uVar6 < __n; uVar6 = uVar6 + 1) {
      pvVar3 = vector<duckdb::Vector,_true>::get<true>(&result->data,uVar6);
      pvVar4 = vector<duckdb::Vector,_true>::get<true>(&input->data,uVar6);
      Vector::Reference(pvVar3,pvVar4);
    }
    for (; __n < (ulong)(((long)(result->data).
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(result->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x68); __n = __n + 1) {
      pvVar3 = vector<duckdb::Vector,_true>::get<true>(&result->data,__n);
      Vector::SetVectorType(pvVar3,CONSTANT_VECTOR);
      pvVar3 = vector<duckdb::Vector,_true>::get<true>(&result->data,__n);
      ConstantVector::SetNull(pvVar3,true);
    }
    break;
  case 6:
    DataChunk::Reference(result,input);
    return;
  case 7:
    pvVar3 = vector<duckdb::Vector,_true>::back(&result->data);
    result->count = input->count;
    for (uVar6 = 0;
        uVar6 < (ulong)(((long)(input->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(input->data).
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar6 = uVar6 + 1)
    {
      pvVar4 = vector<duckdb::Vector,_true>::get<true>(&result->data,uVar6);
      other = vector<duckdb::Vector,_true>::get<true>(&input->data,uVar6);
      Vector::Reference(pvVar4,other);
    }
    if (has_null) {
      FlatVector::VerifyFlatVector(pvVar3);
      TemplatedValidityMask<unsigned_long>::SetAllInvalid
                (&(pvVar3->validity).super_TemplatedValidityMask<unsigned_long>,result->count);
      return;
    }
    pdVar1 = pvVar3->data;
    iVar2 = result->count;
    for (iVar5 = 0; iVar2 != iVar5; iVar5 = iVar5 + 1) {
      pdVar1[iVar5] = '\0';
    }
  }
  return;
}

Assistant:

void PhysicalComparisonJoin::ConstructEmptyJoinResult(JoinType join_type, bool has_null, DataChunk &input,
                                                      DataChunk &result) {
	// empty hash table, special case
	if (join_type == JoinType::ANTI) {
		// anti join with empty hash table, NOP join
		// return the input
		D_ASSERT(input.ColumnCount() == result.ColumnCount());
		result.Reference(input);
	} else if (join_type == JoinType::MARK) {
		// MARK join with empty hash table
		D_ASSERT(result.ColumnCount() == input.ColumnCount() + 1);
		auto &result_vector = result.data.back();
		D_ASSERT(result_vector.GetType() == LogicalType::BOOLEAN);
		// for every data vector, we just reference the child chunk
		result.SetCardinality(input);
		for (idx_t i = 0; i < input.ColumnCount(); i++) {
			result.data[i].Reference(input.data[i]);
		}
		// for the MARK vector:
		// if the HT has no NULL values (i.e. empty result set), return a vector that has false for every input
		// entry if the HT has NULL values (i.e. result set had values, but all were NULL), return a vector that
		// has NULL for every input entry
		if (!has_null) {
			auto bool_result = FlatVector::GetData<bool>(result_vector);
			for (idx_t i = 0; i < result.size(); i++) {
				bool_result[i] = false;
			}
		} else {
			FlatVector::Validity(result_vector).SetAllInvalid(result.size());
		}
	} else if (join_type == JoinType::LEFT || join_type == JoinType::OUTER || join_type == JoinType::SINGLE) {
		// LEFT/FULL OUTER/SINGLE join and build side is empty
		// for the LHS we reference the data
		result.SetCardinality(input.size());
		for (idx_t i = 0; i < input.ColumnCount(); i++) {
			result.data[i].Reference(input.data[i]);
		}
		// for the RHS
		for (idx_t k = input.ColumnCount(); k < result.ColumnCount(); k++) {
			result.data[k].SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result.data[k], true);
		}
	}
}